

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O1

void __thiscall ON_Triangle::Spin(ON_Triangle *this,uchar move)

{
  double *pdVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  double dVar4;
  char cVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  undefined3 in_register_00000031;
  ON_3dPoint tmp;
  
  cVar5 = (char)((uint)(CONCAT31(in_register_00000031,move) * 0xab) >> 9);
  if (move != (uchar)(cVar5 * '\x03')) {
    if ((uchar)(move + cVar5 * -3) == '\x01') {
      lVar10 = 0x18;
      lVar11 = 0x30;
    }
    else {
      lVar10 = 0x30;
      lVar11 = 0x18;
    }
    dVar4 = this->m_V[0].z;
    dVar6 = this->m_V[0].x;
    dVar7 = this->m_V[0].y;
    this->m_V[0].z = *(double *)((long)&this->m_V[0].z + lVar11);
    pdVar1 = (double *)((long)&this->m_V[0].x + lVar11);
    dVar8 = pdVar1[1];
    this->m_V[0].x = *pdVar1;
    this->m_V[0].y = dVar8;
    *(undefined8 *)((long)&this->m_V[0].z + lVar11) =
         *(undefined8 *)((long)&this->m_V[0].z + lVar10);
    puVar2 = (undefined8 *)((long)&this->m_V[0].x + lVar10);
    uVar9 = puVar2[1];
    puVar3 = (undefined8 *)((long)&this->m_V[0].x + lVar11);
    *puVar3 = *puVar2;
    puVar3[1] = uVar9;
    *(double *)((long)&this->m_V[0].z + lVar10) = dVar4;
    pdVar1 = (double *)((long)&this->m_V[0].x + lVar10);
    *pdVar1 = dVar6;
    pdVar1[1] = dVar7;
  }
  return;
}

Assistant:

void ON_Triangle::Spin(unsigned char move)
{
  ON_3dPoint tmp;
  switch (move % 3)
  {
  case 0:
    break;
  case 1:
    tmp = m_V[0];
    m_V[0] = m_V[2];
    m_V[2] = m_V[1];
    m_V[1] = tmp;
    break;
  default: //2
    tmp = m_V[0];
    m_V[0] = m_V[1];
    m_V[1] = m_V[2];
    m_V[2] = tmp;
    break;
  }
}